

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsDomain.cpp
# Opt level: O1

void __thiscall HighsDomain::ConflictSet::pushQueue(ConflictSet *this,iterator domchg)

{
  pointer *pp_Var1;
  _Rb_tree_color _Var2;
  iterator __position;
  pointer p_Var3;
  pointer p_Var4;
  _Base_ptr p_Var5;
  bool bVar6;
  long lVar7;
  long lVar8;
  _Rb_tree_const_iterator<HighsDomain::ConflictSet::LocalDomChg> local_10;
  
  __position._M_current =
       (this->resolveQueue).
       super__Vector_base<std::_Rb_tree_const_iterator<HighsDomain::ConflictSet::LocalDomChg>,_std::allocator<std::_Rb_tree_const_iterator<HighsDomain::ConflictSet::LocalDomChg>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->resolveQueue).
      super__Vector_base<std::_Rb_tree_const_iterator<HighsDomain::ConflictSet::LocalDomChg>,_std::allocator<std::_Rb_tree_const_iterator<HighsDomain::ConflictSet::LocalDomChg>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    local_10._M_node = domchg._M_node;
    std::
    vector<std::_Rb_tree_const_iterator<HighsDomain::ConflictSet::LocalDomChg>,std::allocator<std::_Rb_tree_const_iterator<HighsDomain::ConflictSet::LocalDomChg>>>
    ::_M_realloc_insert<std::_Rb_tree_const_iterator<HighsDomain::ConflictSet::LocalDomChg>&>
              ((vector<std::_Rb_tree_const_iterator<HighsDomain::ConflictSet::LocalDomChg>,std::allocator<std::_Rb_tree_const_iterator<HighsDomain::ConflictSet::LocalDomChg>>>
                *)&this->resolveQueue,__position,&local_10);
  }
  else {
    (__position._M_current)->_M_node = domchg._M_node;
    pp_Var1 = &(this->resolveQueue).
               super__Vector_base<std::_Rb_tree_const_iterator<HighsDomain::ConflictSet::LocalDomChg>,_std::allocator<std::_Rb_tree_const_iterator<HighsDomain::ConflictSet::LocalDomChg>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    *pp_Var1 = *pp_Var1 + 1;
  }
  p_Var3 = (this->resolveQueue).
           super__Vector_base<std::_Rb_tree_const_iterator<HighsDomain::ConflictSet::LocalDomChg>,_std::allocator<std::_Rb_tree_const_iterator<HighsDomain::ConflictSet::LocalDomChg>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  p_Var4 = (this->resolveQueue).
           super__Vector_base<std::_Rb_tree_const_iterator<HighsDomain::ConflictSet::LocalDomChg>,_std::allocator<std::_Rb_tree_const_iterator<HighsDomain::ConflictSet::LocalDomChg>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  p_Var5 = p_Var4[-1]._M_node;
  lVar8 = (long)p_Var4 - (long)p_Var3 >> 3;
  lVar7 = lVar8 + -1;
  if (1 < lVar8) {
    _Var2 = p_Var5[1]._M_color;
    do {
      lVar8 = (lVar7 - (lVar7 + -1 >> 0x3f)) + -1 >> 1;
      if ((int)_Var2 <= (int)p_Var3[lVar8]._M_node[1]._M_color) break;
      p_Var3[lVar7]._M_node = p_Var3[lVar8]._M_node;
      bVar6 = 2 < lVar7;
      lVar7 = lVar8;
    } while (bVar6);
  }
  p_Var3[lVar7]._M_node = p_Var5;
  return;
}

Assistant:

void HighsDomain::ConflictSet::pushQueue(
    std::set<LocalDomChg>::iterator domchg) {
  resolveQueue.emplace_back(domchg);
  std::push_heap(
      resolveQueue.begin(), resolveQueue.end(),
      [](const std::set<LocalDomChg>::iterator& a,
         const std::set<LocalDomChg>::iterator& b) { return a->pos < b->pos; });
}